

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O0

void __thiscall
gvr::TexturedMesh::resizeVertexList(TexturedMesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  ulong uVar4;
  void *pvVar5;
  int *piVar6;
  byte in_CL;
  byte bVar7;
  byte in_DL;
  int in_ESI;
  PointCloud *in_RDI;
  int i_1;
  int i;
  float *p;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined2 in_stack_fffffffffffffff0;
  
  bVar7 = in_DL & 1;
  bVar3 = in_CL & 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_ESI << 1);
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  local_20 = PointCloud::getVertexCount(in_RDI);
  piVar6 = std::min<int>(&local_20,(int *)&stack0xfffffffffffffff4);
  local_1c = *piVar6 * 2;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    *(undefined4 *)((long)pvVar5 + (long)local_1c * 4) =
         *(undefined4 *)((long)in_RDI[1].super_Model.Rc.v[2][0] + (long)local_1c * 4);
  }
  local_28 = PointCloud::getVertexCount(in_RDI);
  piVar6 = std::min<int>(&local_28,(int *)&stack0xfffffffffffffff4);
  for (local_24 = *piVar6 << 1; SBORROW4(local_24,in_ESI * 2) != local_24 + in_ESI * -2 < 0;
      local_24 = local_24 + 1) {
    *(undefined4 *)((long)pvVar5 + (long)local_24 * 4) = 0;
  }
  pvVar1 = (void *)in_RDI[1].super_Model.Rc.v[2][0];
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  in_RDI[1].super_Model.Rc.v[2][0] = (double)pvVar5;
  Mesh::resizeVertexList
            ((Mesh *)CONCAT44(in_ESI,CONCAT13(bVar7,CONCAT12(bVar3,in_stack_fffffffffffffff0))),
             (int)((ulong)pvVar5 >> 0x20),SUB81((ulong)pvVar5 >> 0x18,0),
             SUB81((ulong)pvVar5 >> 0x10,0));
  return;
}

Assistant:

void TexturedMesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [2*vn];

  for (int i=2*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=uv[i];
  }

  for (int i=2*std::min(getVertexCount(), vn); i<2*vn; i++)
  {
    p[i]=0;
  }

  delete [] uv;

  uv=p;

  Mesh::resizeVertexList(vn, with_scanprop, with_scanpos);
}